

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int aead_decrypt_1rtt(void *ctx,uint64_t pn,quicly_decoded_packet_t *packet,size_t aead_off,
                     size_t *ptlen)

{
  uint8_t *puVar1;
  long lVar2;
  uint8_t *puVar3;
  uint64_t newly_decrypted_key_phase;
  uint uVar4;
  int iVar5;
  long lVar6;
  ptls_cipher_suite_t *cipher;
  size_t sVar7;
  ptls_aead_context_t **aead;
  byte *pbVar8;
  ptls_aead_context_t *ppVar9;
  
  lVar2 = *(long *)((long)ctx + 0x540);
  pbVar8 = (packet->octets).base;
  uVar4 = *pbVar8 >> 2 & 1;
  aead = (ptls_aead_context_t **)((ulong)uVar4 * 8 + 0x58 + lVar2);
  ppVar9 = *aead;
  lVar6 = lVar2;
  if (ppVar9 != (ptls_aead_context_t *)0x0) goto LAB_00128ad0;
  while( true ) {
    if (*(ptls_cipher_context_t **)(lVar6 + 0x48) != (ptls_cipher_context_t *)0x0) {
      ptls_cipher_free(*(ptls_cipher_context_t **)(lVar6 + 0x48));
      *(undefined8 *)(*(long *)((long)ctx + 0x540) + 0x48) = 0;
    }
    cipher = ptls_get_cipher(*(ptls_t **)((long)ctx + 0x8b0));
    iVar5 = update_1rtt_key((quicly_conn_t *)ctx,cipher,0,aead,(uint8_t *)(lVar2 + 0x68));
    if (iVar5 != 0) {
      return iVar5;
    }
    *(long *)(lVar2 + 0xa8) = *(long *)(lVar2 + 0xa8) + 1;
    ppVar9 = *aead;
    pbVar8 = (packet->octets).base;
LAB_00128ad0:
    sVar7 = (*ppVar9->do_decrypt)
                      (ppVar9,pbVar8 + aead_off,pbVar8 + aead_off,(packet->octets).len - aead_off,pn
                       ,pbVar8,aead_off);
    *ptlen = sVar7;
    if (sVar7 != 0xffffffffffffffff) {
      newly_decrypted_key_phase = *(uint64_t *)(lVar2 + 0xa8);
      if (((newly_decrypted_key_phase != *(uint64_t *)(lVar2 + 0xb0)) &&
          (((uint)newly_decrypted_key_phase & 1) == uVar4)) &&
         (iVar5 = received_key_update((quicly_conn_t *)ctx,newly_decrypted_key_phase), iVar5 != 0))
      {
        return iVar5;
      }
      return 0;
    }
    if (*(long *)(lVar2 + 0xb0) != *(long *)(lVar2 + 0xa8)) {
      return 0xff01;
    }
    if (((uint)*(long *)(lVar2 + 0xb0) & 1) == uVar4) break;
    puVar3 = (packet->octets).base;
    puVar1 = puVar3 + aead_off;
    (*ppVar9->do_decrypt)(ppVar9,puVar1,puVar1,(packet->octets).len - aead_off,pn,puVar3,aead_off);
    lVar6 = *(long *)((long)ctx + 0x540);
  }
  return 0xff01;
}

Assistant:

static int aead_decrypt_1rtt(void *ctx, uint64_t pn, quicly_decoded_packet_t *packet, size_t aead_off, size_t *ptlen)
{
    quicly_conn_t *conn = ctx;
    struct st_quicly_application_space_t *space = conn->application;
    size_t aead_index = (packet->octets.base[0] & QUICLY_KEY_PHASE_BIT) != 0;
    int ret;

    /* prepare key, when not available (yet) */
    if (space->cipher.ingress.aead[aead_index] == NULL) {
    Retry_1RTT : {
        /* Replace the AEAD key at the alternative slot (note: decryption key slots are shared by 0-RTT and 1-RTT), at the same time
         * dropping 0-RTT header protection key. */
        if (conn->application->cipher.ingress.header_protection.zero_rtt != NULL) {
            ptls_cipher_free(conn->application->cipher.ingress.header_protection.zero_rtt);
            conn->application->cipher.ingress.header_protection.zero_rtt = NULL;
        }
        ptls_cipher_suite_t *cipher = ptls_get_cipher(conn->crypto.tls);
        if ((ret = update_1rtt_key(conn, cipher, 0, &space->cipher.ingress.aead[aead_index], space->cipher.ingress.secret)) != 0)
            return ret;
        ++space->cipher.ingress.key_phase.prepared;
        QUICLY_PROBE(CRYPTO_RECEIVE_KEY_UPDATE_PREPARE, conn, conn->stash.now, space->cipher.ingress.key_phase.prepared,
                     QUICLY_PROBE_HEXDUMP(space->cipher.ingress.secret, cipher->hash->digest_size));
    }
    }

    /* decrypt */
    ptls_aead_context_t *aead = space->cipher.ingress.aead[aead_index];
    if ((*ptlen = aead_decrypt_core(aead, pn, packet, aead_off)) == SIZE_MAX) {
        /* retry with a new key, if possible */
        if (space->cipher.ingress.key_phase.decrypted == space->cipher.ingress.key_phase.prepared &&
            space->cipher.ingress.key_phase.decrypted % 2 != aead_index) {
            /* reapply AEAD to revert payload to the encrypted form. This assumes that the cipher used in AEAD is CTR. */
            aead_decrypt_core(aead, pn, packet, aead_off);
            goto Retry_1RTT;
        }
        /* otherwise return failure */
        return QUICLY_ERROR_PACKET_IGNORED;
    }

    /* update the confirmed key phase and also the egress key phase, if necessary */
    if (space->cipher.ingress.key_phase.prepared != space->cipher.ingress.key_phase.decrypted &&
        space->cipher.ingress.key_phase.prepared % 2 == aead_index) {
        if ((ret = received_key_update(conn, space->cipher.ingress.key_phase.prepared)) != 0)
            return ret;
    }

    return 0;
}